

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

void __thiscall
QSqlRelationalTableModel::setRelation
          (QSqlRelationalTableModel *this,int column,QSqlRelation *relation)

{
  long lVar1;
  Data *dd;
  undefined4 *puVar2;
  pointer pQVar3;
  qsizetype i;
  ulong uVar4;
  ulong uVar5;
  
  if (-1 < column) {
    lVar1 = *(long *)(this + 8);
    uVar4 = *(ulong *)(lVar1 + 0x2f8);
    if (uVar4 <= (uint)column) {
      QList<QSharedPointer<QRelation>_>::resize
                ((QList<QSharedPointer<QRelation>_> *)(lVar1 + 0x2e8),(ulong)(column + 1));
      if (uVar4 < *(ulong *)(lVar1 + 0x2f8)) {
        uVar5 = uVar4 << 4 | 8;
        do {
          puVar2 = (undefined4 *)operator_new(0x78);
          *(code **)(puVar2 + 2) =
               QtSharedPointer::ExternalRefCountWithContiguousData<QRelation>::noDeleter;
          puVar2[1] = 1;
          *puVar2 = 1;
          *(undefined8 *)(puVar2 + 0x18) = 0;
          *(undefined8 *)(puVar2 + 0x1a) = 0;
          *(undefined8 *)(puVar2 + 0x14) = 0;
          *(undefined8 *)(puVar2 + 0x16) = 0;
          *(undefined8 *)(puVar2 + 0x10) = 0;
          *(undefined8 *)(puVar2 + 0x12) = 0;
          *(undefined8 *)(puVar2 + 0xc) = 0;
          *(undefined8 *)(puVar2 + 0xe) = 0;
          *(undefined8 *)(puVar2 + 8) = 0;
          *(undefined8 *)(puVar2 + 10) = 0;
          *(undefined8 *)(puVar2 + 4) = 0;
          *(undefined8 *)(puVar2 + 6) = 0;
          *(undefined8 *)(puVar2 + 0x1c) = 0;
          puVar2[0x1c] = 0xffffffff;
          *(undefined1 *)(puVar2 + 0x1d) = 0;
          *(code **)(puVar2 + 2) =
               QtSharedPointer::ExternalRefCountWithContiguousData<QRelation>::deleter;
          pQVar3 = QList<QSharedPointer<QRelation>_>::data
                             ((QList<QSharedPointer<QRelation>_> *)(lVar1 + 0x2e8));
          dd = *(Data **)((long)&(pQVar3->value).ptr + uVar5);
          *(undefined4 **)((long)&(pQVar3->value).ptr + uVar5) = puVar2;
          *(undefined4 **)((long)pQVar3 + (uVar5 - 8)) = puVar2 + 4;
          QSharedPointer<QRelation>::deref(dd);
          QSharedPointer<QRelation>::deref((Data *)0x0);
          uVar4 = uVar4 + 1;
          uVar5 = uVar5 + 0x10;
        } while (uVar4 < *(ulong *)(lVar1 + 0x2f8));
      }
    }
    QRelation::init(*(QRelation **)(*(long *)(lVar1 + 0x2f0) + (ulong)(uint)column * 0x10),
                    (EVP_PKEY_CTX *)this);
    return;
  }
  return;
}

Assistant:

void QSqlRelationalTableModel::setRelation(int column, const QSqlRelation &relation)
{
    Q_D(QSqlRelationalTableModel);
    if (column < 0)
        return;
    if (d->relations.size() <= column) {
        const auto oldSize = d->relations.size();
        d->relations.resize(column + 1);
        for (auto i = oldSize; i < d->relations.size(); ++i)
            d->relations[i] = QSharedPointer<QRelation>::create();
    }
    d->relations.at(column)->init(this, relation, column);
}